

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O3

int Sbd_ManCollectConstants
              (sat_solver *pSat,int *nCareMints,int PivotVar,word **pVarSims,Vec_Int_t *vInds)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  undefined4 in_register_00000014;
  ulong uVar7;
  long lVar8;
  int iLit;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  Vec_Int_t *local_40;
  int *local_38;
  
  local_48 = CONCAT44(in_register_00000014,PivotVar);
  local_38 = nCareMints;
  if (vInds->nSize != nCareMints[1] + *nCareMints) {
    __assert_fail("Vec_IntSize(vInds) == nCareMints[0] + nCareMints[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                  ,0x19f,
                  "int Sbd_ManCollectConstants(sat_solver *, int *, int, word **, Vec_Int_t *)");
  }
  if (0 < vInds->nSize) {
    local_4c = PivotVar * 2;
    lVar8 = 0;
    local_40 = vInds;
    do {
      if ((int)local_48 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      iVar1 = local_40->pArray[lVar8];
      iVar5 = *local_38;
      local_50 = local_4c | lVar8 < iVar5;
      sat_solver_random_polarity(pSat);
      iVar4 = sat_solver_solve(pSat,(lit *)&local_50,(lit *)&local_4c,0,0,0,0);
      if (iVar4 == -1) {
        return (uint)(lVar8 < iVar5);
      }
      if (iVar4 == 0) {
        return -2;
      }
      iVar5 = iVar1 >> 6;
      bVar6 = (byte)iVar1 & 0x3f;
      uVar3 = pSat->size;
      if (pSat->size < 1) {
        uVar3 = 0;
      }
      uVar7 = 0;
      do {
        if (uVar3 == uVar7) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        uVar2 = pVarSims[uVar7][iVar5];
        if (((pSat->model[uVar7] != 1 ^ (byte)(uVar2 >> bVar6)) & 1) == 0) {
          pVarSims[uVar7][iVar5] = uVar2 ^ 1L << bVar6;
        }
        uVar7 = uVar7 + 1;
      } while (PivotVar + 1 != uVar7);
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_40->nSize);
  }
  return -1;
}

Assistant:

int Sbd_ManCollectConstants( sat_solver * pSat, int nCareMints[2], int PivotVar, word * pVarSims[], Vec_Int_t * vInds )
{
    int nBTLimit = 0;
    int i, Ind; 
    assert( Vec_IntSize(vInds) == nCareMints[0] + nCareMints[1] );
    Vec_IntForEachEntry( vInds, Ind, i )
    {
        int fOffSet = (int)(i < nCareMints[0]);
        int status, k, iLit = Abc_Var2Lit( PivotVar, fOffSet );
        sat_solver_random_polarity( pSat );
        status = sat_solver_solve( pSat, &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return -2;
        if ( status == l_False )
            return fOffSet;
        for ( k = 0; k <= PivotVar; k++ )
            if ( Abc_TtGetBit(pVarSims[k], Ind) != sat_solver_var_value(pSat, k) )
                Abc_TtXorBit(pVarSims[k], Ind);
    }
    return -1;
}